

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.c
# Opt level: O3

void hd_consumer_create(hd_context *ctx,hd_disk *disk,hd_part *part)

{
  hd_pthread_context *phVar1;
  int iVar2;
  uint *puVar3;
  
  phVar1 = ctx->pthread;
  (phVar1->consumer).ctx = ctx;
  (phVar1->consumer).part = part;
  (phVar1->consumer).disk = disk;
  (phVar1->consumer).index = 0;
  iVar2 = pthread_create(&(phVar1->consumer).threadid,(pthread_attr_t *)&phVar1->thread_attr,
                         consumer_thread,&phVar1->consumer);
  if (-1 < iVar2) {
    ctx->pthread->consumer_thread_num = 1;
    return;
  }
  puVar3 = (uint *)__errno_location();
  hd_throw(ctx,2,"pthread_create consumer failed\t: %d\n",(ulong)*puVar3);
}

Assistant:

void
hd_consumer_create(hd_context *ctx, hd_disk *disk, hd_part *part)
{

    /*FIXME:ctx->pthread->consumer should be an array*/
    int index = 1;
    ctx->pthread->consumer.ctx = ctx;
    ctx->pthread->consumer.part = part;
    ctx->pthread->consumer.disk = disk;
    ctx->pthread->consumer.index = 0;
    if (pthread_create(&ctx->pthread->consumer.threadid, &ctx->pthread->thread_attr,
                       consumer_thread, &ctx->pthread->consumer) < 0)
        hd_throw(ctx,HD_ERROR_GENERIC, "pthread_create consumer failed	: %d\n", errno);

    ctx->pthread->consumer_thread_num = index;
}